

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void server::_doflagrun(clientinfo *ci,int timeused)

{
  undefined8 *puVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  undefined8 *puVar7;
  ulong uVar8;
  bool bVar9;
  stringformatter local_140;
  string msg;
  
  uVar2 = DAT_00191cfc;
  iVar4 = gamemode;
  if (timeused < 0x1f5) {
    pcVar5 = colorname(ci);
    out(3,"\f0%s \f7scored a \f6MEGARUN!",pcVar5);
    return;
  }
  if (serverflagruns != 0) {
    lVar6 = (long)(int)DAT_00191cfc;
    uVar8 = 0;
    puVar7 = _flagruns;
    if (0 < (int)DAT_00191cfc) {
      uVar8 = (ulong)DAT_00191cfc;
    }
    while (bVar9 = uVar8 != 0, uVar8 = uVar8 - 1, bVar9) {
      if ((*(int *)(puVar7 + 1) == iVar4) && (iVar3 = strcmp((char *)*puVar7,&smapname), iVar3 == 0)
         ) {
        if (timeused <= *(int *)(puVar7 + 3)) {
          pcVar5 = (char *)puVar7[2];
          goto LAB_001333e7;
        }
        local_140.buf = msg;
        pcVar5 = colorname(ci);
        stringformatter::operator()
                  (&local_140,
                   "\f0%s \f7scored a flagrun in \f7%i.%02i \f7seconds (\f2best: \f0%s \f7%i.%02i\f7)"
                   ,pcVar5,(ulong)(uint)timeused / 1000,
                   (ulong)(ushort)((ushort)((ulong)(uint)timeused % 1000) / 10),puVar7[2],
                   (long)*(int *)(puVar7 + 3) / 1000 & 0xffffffff,
                   (ulong)(uint)(int)(short)((short)((long)*(int *)(puVar7 + 3) % 1000) / 10));
        goto LAB_00133472;
      }
      puVar7 = puVar7 + 4;
    }
    if ((int)uVar2 < 0x400) {
      vector<server::_flagrun>::add((vector<server::_flagrun> *)&_flagruns);
      pcVar5 = newstring(&smapname);
      puVar7 = _flagruns;
      _flagruns[lVar6 * 4] = pcVar5;
      *(int *)(puVar7 + lVar6 * 4 + 1) = gamemode;
      pcVar5 = newstring(ci->name);
      puVar1 = _flagruns;
      puVar7 = _flagruns + lVar6 * 4;
      _flagruns[lVar6 * 4 + 2] = pcVar5;
      *(int *)(puVar1 + lVar6 * 4 + 3) = timeused;
LAB_001333e7:
      _newflagrun = 1;
      iVar4 = strcmp(ci->name,pcVar5);
      if (iVar4 != 0) {
        if (pcVar5 != (char *)0x0) {
          operator_delete__(pcVar5);
          puVar7[2] = 0;
        }
        pcVar5 = newstring(ci->name);
        puVar7[2] = pcVar5;
      }
      *(int *)(puVar7 + 3) = timeused;
      local_140.buf = msg;
      pcVar5 = colorname(ci);
      stringformatter::operator()
                (&local_140,"\f0%s \f7scored a flagrun in \f7%i.%02i \f7seconds (\f2best\f7)",pcVar5
                 ,(ulong)(uint)timeused / 1000,
                 (ulong)(ushort)((ushort)((ulong)(uint)timeused % 1000) / 10));
LAB_00133472:
      sendservmsg(msg);
    }
  }
  return;
}

Assistant:

void _doflagrun(clientinfo *ci, int timeused)
    {
        if(timeused <= 500)
        {
            out(ECHO_SERV, "\f0%s \f7scored a \f6MEGARUN!", colorname(ci));
            return;
        }
        if(serverflagruns)
        {
            _flagrun *fr = 0;
            loopv(_flagruns) if(_flagruns[i].gamemode == gamemode && !strcmp(_flagruns[i].map, smapname))
            { fr = &_flagruns[i]; break; }
            bool isbest = false;
            if(!fr)
            {
                isbest = true;
                int lastfr = _flagruns.length();
                if(lastfr >= 1024) return;
                _flagruns.add();
                _flagruns[lastfr].map = newstring(smapname);
                _flagruns[lastfr].gamemode = gamemode;
                _flagruns[lastfr].name = newstring(ci->name);
                _flagruns[lastfr].timeused = timeused;
                fr = &_flagruns[lastfr];
            }
            isbest = isbest || timeused <= fr->timeused;
            if(isbest)
            {
                _newflagrun = 1;
                if(strcmp(ci->name, fr->name))
                {
                    DELETEA(fr->name);
                    fr->name = newstring(ci->name);
                }
                fr->timeused = timeused;
            }
            string msg;
            if(isbest) formatstring(msg)("\f0%s \f7scored a flagrun in \f7%i.%02i \f7seconds (\f2best\f7)",
                                         colorname(ci), timeused/1000, (timeused%1000)/10);
            else formatstring(msg)("\f0%s \f7scored a flagrun in \f7%i.%02i \f7seconds (\f2best: \f0%s \f7%i.%02i\f7)",
                                   colorname(ci), timeused/1000, (timeused%1000)/10, fr->name, fr->timeused/1000, (fr->timeused%1000)/10);
            sendservmsg(msg);
        }
    }